

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_binary<embree::Vec2<int>>
          (XMLWriter *this,char *name,
          vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *vec)

{
  pointer pVVar1;
  ostream *poVar2;
  
  std::istream::tellg();
  tab(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"<");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2," ofs=\"");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,"\" size=\"");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\"/>");
  std::endl<char,std::char_traits<char>>(poVar2);
  pVVar1 = (vec->super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    std::ostream::write(&this->field_0x220,(long)pVVar1);
    return;
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const std::vector<T>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    if (vec.size()) bin.write((char*)vec.data(),vec.size()*sizeof(T));
  }